

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::UntypedMapBase::ClearTable(UntypedMapBase *this,ClearInput input)

{
  undefined8 *puVar1;
  uint uVar2;
  TableEntryPtr *pTVar3;
  NodeBase *pNVar4;
  long *plVar5;
  bool bVar6;
  TreeForMap *pTVar7;
  NodeBase *pNVar8;
  long *plVar9;
  ulong uVar10;
  ulong uVar11;
  UntypedMapBase *this_00;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  *pbVar12;
  undefined8 *in_R8;
  ulong uVar13;
  btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *this_01;
  iterator iVar14;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  bStack_90;
  VariantKey VStack_80;
  
  uVar10 = input._0_8_;
  uVar2 = this->num_buckets_;
  uVar11 = (ulong)uVar2;
  if (uVar11 == 1) {
    this_00 = (UntypedMapBase *)&stack0xffffffffffffffc0;
    ClearTable(this_00);
    pbVar12 = &bStack_90;
    if ((this_00->table_[uVar10 & 0xffffffff] & 1) == 0) {
      FindFromTree();
      if ((ulong)*(uint *)((long)pbVar12 + 4) != 0) {
        uVar11 = 0;
        do {
          uVar11 = uVar11 + 1;
        } while (*(uint *)((long)pbVar12 + 4) != uVar11);
      }
      return;
    }
    this_01 = (btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
               *)(this_00->table_[uVar10 & 0xffffffff] - 1);
    iVar14 = absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
             ::find<google::protobuf::internal::VariantKey>(this_01,&VStack_80);
    bStack_90.node_ = iVar14.node_;
    bStack_90.position_ = iVar14.position_;
    if (in_R8 != (undefined8 *)0x0) {
      *(int *)(in_R8 + 1) = bStack_90.position_;
      *in_R8 = bStack_90.node_;
    }
    iVar14 = absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
             ::end(this_01);
    bVar6 = absl::lts_20240722::container_internal::
            btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
            ::Equals(&bStack_90,(const_iterator)iVar14);
    if (!bVar6) {
      absl::lts_20240722::container_internal::
      btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
      ::operator*(&bStack_90);
    }
    return;
  }
  if (((this->alloc_).arena_ == (Arena *)0x0) && (input.destroy_bits < 9)) {
    switch(uVar10 >> 0x20 & 0xff) {
    case 0:
      uVar13 = (ulong)this->index_of_first_non_null_;
      if (this->index_of_first_non_null_ < uVar2) {
        pTVar3 = this->table_;
        do {
          pNVar8 = (NodeBase *)pTVar3[uVar13];
          if (((ulong)pNVar8 & 1) != 0) {
            pTVar7 = TableEntryToTree((TableEntryPtr)pNVar8);
            pNVar8 = DestroyTree(this,pTVar7);
          }
          while (pNVar8 != (NodeBase *)0x0) {
            pNVar4 = pNVar8->next;
            operator_delete(pNVar8,uVar10 >> 0x10 & 0xffff);
            pNVar8 = pNVar4;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar11);
      }
      break;
    case 1:
      uVar13 = (ulong)this->index_of_first_non_null_;
      if (this->index_of_first_non_null_ < uVar2) {
        pTVar3 = this->table_;
        do {
          pNVar8 = (NodeBase *)pTVar3[uVar13];
          if (((ulong)pNVar8 & 1) != 0) {
            pTVar7 = TableEntryToTree((TableEntryPtr)pNVar8);
            pNVar8 = DestroyTree(this,pTVar7);
          }
          while (pNVar8 != (NodeBase *)0x0) {
            pNVar4 = pNVar8->next;
            if (pNVar8[1].next != pNVar8 + 3) {
              operator_delete(pNVar8[1].next,(ulong)((long)&(pNVar8[3].next)->next + 1));
            }
            operator_delete(pNVar8,uVar10 >> 0x10 & 0xffff);
            pNVar8 = pNVar4;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar11);
      }
      break;
    case 2:
      uVar13 = (ulong)this->index_of_first_non_null_;
      if (this->index_of_first_non_null_ < uVar2) {
        pTVar3 = this->table_;
        do {
          pNVar8 = (NodeBase *)pTVar3[uVar13];
          if (((ulong)pNVar8 & 1) != 0) {
            pTVar7 = TableEntryToTree((TableEntryPtr)pNVar8);
            pNVar8 = DestroyTree(this,pTVar7);
          }
          while (pNVar8 != (NodeBase *)0x0) {
            pNVar4 = pNVar8->next;
            puVar1 = (undefined8 *)((long)&pNVar8->next + (uVar10 & 0xffff));
            plVar9 = puVar1 + 2;
            plVar5 = (long *)*puVar1;
            if (plVar5 != plVar9) {
              operator_delete(plVar5,*plVar9 + 1);
            }
            operator_delete(pNVar8,uVar10 >> 0x10 & 0xffff);
            pNVar8 = pNVar4;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar11);
      }
      break;
    case 3:
      uVar13 = (ulong)this->index_of_first_non_null_;
      if (this->index_of_first_non_null_ < uVar2) {
        pTVar3 = this->table_;
        do {
          pNVar8 = (NodeBase *)pTVar3[uVar13];
          if (((ulong)pNVar8 & 1) != 0) {
            pTVar7 = TableEntryToTree((TableEntryPtr)pNVar8);
            pNVar8 = DestroyTree(this,pTVar7);
          }
          while (pNVar8 != (NodeBase *)0x0) {
            pNVar4 = pNVar8->next;
            if (pNVar8[1].next != pNVar8 + 3) {
              operator_delete(pNVar8[1].next,(ulong)((long)&(pNVar8[3].next)->next + 1));
            }
            puVar1 = (undefined8 *)((long)&pNVar8->next + (uVar10 & 0xffff));
            plVar9 = puVar1 + 2;
            plVar5 = (long *)*puVar1;
            if (plVar5 != plVar9) {
              operator_delete(plVar5,*plVar9 + 1);
            }
            operator_delete(pNVar8,uVar10 >> 0x10 & 0xffff);
            pNVar8 = pNVar4;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar11);
      }
      break;
    case 4:
      uVar13 = (ulong)this->index_of_first_non_null_;
      if (this->index_of_first_non_null_ < uVar2) {
        pTVar3 = this->table_;
        do {
          pNVar8 = (NodeBase *)pTVar3[uVar13];
          if (((ulong)pNVar8 & 1) != 0) {
            pTVar7 = TableEntryToTree((TableEntryPtr)pNVar8);
            pNVar8 = DestroyTree(this,pTVar7);
          }
          while (pNVar8 != (NodeBase *)0x0) {
            pNVar4 = pNVar8->next;
            MessageLite::DestroyInstance((MessageLite *)((long)&pNVar8->next + (uVar10 & 0xffff)));
            operator_delete(pNVar8,uVar10 >> 0x10 & 0xffff);
            pNVar8 = pNVar4;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar11);
      }
      break;
    case 5:
      uVar13 = (ulong)this->index_of_first_non_null_;
      if (this->index_of_first_non_null_ < uVar2) {
        pTVar3 = this->table_;
        do {
          pNVar8 = (NodeBase *)pTVar3[uVar13];
          if (((ulong)pNVar8 & 1) != 0) {
            pTVar7 = TableEntryToTree((TableEntryPtr)pNVar8);
            pNVar8 = DestroyTree(this,pTVar7);
          }
          while (pNVar8 != (NodeBase *)0x0) {
            pNVar4 = pNVar8->next;
            if (pNVar8[1].next != pNVar8 + 3) {
              operator_delete(pNVar8[1].next,(ulong)((long)&(pNVar8[3].next)->next + 1));
            }
            MessageLite::DestroyInstance((MessageLite *)((long)&pNVar8->next + (uVar10 & 0xffff)));
            operator_delete(pNVar8,uVar10 >> 0x10 & 0xffff);
            pNVar8 = pNVar4;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar11);
      }
      break;
    case 6:
    case 7:
      break;
    case 8:
      uVar13 = (ulong)this->index_of_first_non_null_;
      if (this->index_of_first_non_null_ < uVar2) {
        pTVar3 = this->table_;
        do {
          pNVar8 = (NodeBase *)pTVar3[uVar13];
          if (((ulong)pNVar8 & 1) != 0) {
            pTVar7 = TableEntryToTree((TableEntryPtr)pNVar8);
            pNVar8 = DestroyTree(this,pTVar7);
          }
          while (pNVar8 != (NodeBase *)0x0) {
            pNVar4 = pNVar8->next;
            (*input.destroy_node)(pNVar8);
            operator_delete(pNVar8,uVar10 >> 0x10 & 0xffff);
            pNVar8 = pNVar4;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar11);
      }
      break;
    default:
      return;
    }
  }
  if ((uVar10 >> 0x28 & 1) == 0) {
    DeleteTable(this,this->table_,this->num_buckets_);
    return;
  }
  uVar2 = this->num_buckets_;
  if ((ulong)uVar2 != 0) {
    memset(this->table_,0,(ulong)uVar2 << 3);
  }
  this->num_elements_ = 0;
  this->index_of_first_non_null_ = uVar2;
  return;
}

Assistant:

void UntypedMapBase::ClearTable(const ClearInput input) {
  ABSL_DCHECK_NE(num_buckets_, kGlobalEmptyTableSize);

  if (alloc_.arena() == nullptr) {
    const auto loop = [=](auto destroy_node) {
      const TableEntryPtr* table = table_;
      for (map_index_t b = index_of_first_non_null_, end = num_buckets_;
           b < end; ++b) {
        NodeBase* node =
            PROTOBUF_PREDICT_FALSE(internal::TableEntryIsTree(table[b]))
                ? DestroyTree(TableEntryToTree(table[b]))
                : TableEntryToNode(table[b]);

        while (node != nullptr) {
          NodeBase* next = node->next;
          destroy_node(node);
          SizedDelete(node, SizeFromInfo(input.size_info));
          node = next;
        }
      }
    };
    switch (input.destroy_bits) {
      case 0:
        loop([](NodeBase*) {});
        break;
      case kKeyIsString:
        loop([](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
        });
        break;
      case kValueIsString:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidValue(size_info))
              ->~basic_string();
        });
        break;
      case kKeyIsString | kValueIsString:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
          static_cast<std::string*>(node->GetVoidValue(size_info))
              ->~basic_string();
        });
        break;
      case kValueIsProto:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<MessageLite*>(node->GetVoidValue(size_info))
              ->DestroyInstance();
        });
        break;
      case kKeyIsString | kValueIsProto:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
          static_cast<MessageLite*>(node->GetVoidValue(size_info))
              ->DestroyInstance();
        });
        break;
      case kUseDestructFunc:
        loop(input.destroy_node);
        break;
    }
  }

  if (input.reset_table) {
    std::fill(table_, table_ + num_buckets_, TableEntryPtr{});
    num_elements_ = 0;
    index_of_first_non_null_ = num_buckets_;
  } else {
    DeleteTable(table_, num_buckets_);
  }
}